

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O3

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad>::ComputeSolutionKernelHdivT<std::complex<double>>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  TPZSolVec<std::complex<double>_> *sol;
  undefined8 *puVar1;
  TPZManVector<std::complex<double>,_10> *pTVar2;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar3;
  int iVar4;
  long *plVar5;
  TPZCompMesh *pTVar6;
  TPZFMatrix<std::complex<double>_> *pTVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  sol = &data->sol;
  TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
            (&this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>,
             &(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,
             &(data->super_TPZMaterialData).curlphi.super_TPZFMatrix<double>,sol,&data->curlsol);
  plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>).
                                          super_TPZIntelGen<pzshape::TPZShapeQuad>.
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  iVar4 = (**(code **)(*plVar5 + 0x78))(plVar5);
  (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>).
                         super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x90))(this);
  pTVar6 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar6->fSolution);
  if ((pTVar7->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol == 1) {
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(sol,1);
    TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize(&data->dsol,1);
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(&data->divsol,1);
    lVar10 = 0;
    do {
      pTVar2 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      (*pTVar2[lVar10].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])
                (pTVar2 + lVar10,(long)(iVar4 * 3));
      pTVar2 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      lVar8 = pTVar2[lVar10].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar2[lVar10].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar9);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar9 = lVar9 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      pTVar3 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore;
      (*pTVar3[lVar10].super_TPZFMatrix<std::complex<double>_>.
        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(pTVar3 + lVar10,(long)(iVar4 * 3),3);
      pTVar2 = (data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      (*pTVar2[lVar10].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])
                (pTVar2 + lVar10,(long)iVar4);
      pTVar2 = (data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      lVar8 = pTVar2[lVar10].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar2[lVar10].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar9);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar9 = lVar9 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 1);
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::operator=(sol,&data->curlsol);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
             ,0xaf);
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}